

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::IEEEFloat::handleOverflow(IEEEFloat *this,roundingMode rounding_mode)

{
  uint parts;
  integerPart *dst;
  roundingMode rounding_mode_local;
  IEEEFloat *this_local;
  
  if ((((rounding_mode == rmNearestTiesToEven) || (rounding_mode == rmNearestTiesToAway)) ||
      ((rounding_mode == rmTowardPositive && (((byte)this->field_0x12 >> 3 & 1) == 0)))) ||
     ((rounding_mode == rmTowardNegative && (((byte)this->field_0x12 >> 3 & 1) != 0)))) {
    this->field_0x12 = this->field_0x12 & 0xf8;
    this_local._4_4_ = opInexact|opOverflow;
  }
  else {
    this->field_0x12 = this->field_0x12 & 0xf8 | 2;
    this->exponent = this->semantics->maxExponent;
    dst = significandParts(this);
    parts = partCount(this);
    APInt::tcSetLeastSignificantBits(dst,parts,this->semantics->precision);
    this_local._4_4_ = opInexact;
  }
  return this_local._4_4_;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::handleOverflow(roundingMode rounding_mode) {
  /* Infinity?  */
  if (rounding_mode == rmNearestTiesToEven ||
      rounding_mode == rmNearestTiesToAway ||
      (rounding_mode == rmTowardPositive && !sign) ||
      (rounding_mode == rmTowardNegative && sign)) {
    category = fcInfinity;
    return (opStatus) (opOverflow | opInexact);
  }

  /* Otherwise we become the largest finite number.  */
  category = fcNormal;
  exponent = semantics->maxExponent;
  APInt::tcSetLeastSignificantBits(significandParts(), partCount(),
                                   semantics->precision);

  return opInexact;
}